

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_fbs.cpp
# Opt level: O1

string * flatbuffers::anon_unknown_0::GenerateFBS
                   (string *__return_storage_ptr__,Parser *parser,string *file_name,bool no_log)

{
  _Rb_tree_header *p_Var1;
  string *__rhs;
  byte bVar2;
  ushort uVar3;
  ProtoIdGapAction PVar4;
  Namespace *this;
  EnumDef *this_00;
  EnumVal *ev;
  pointer ppFVar5;
  FieldDef *pFVar6;
  size_type sVar7;
  undefined8 *puVar8;
  _Rb_tree_node_base *p_Var9;
  const_iterator cVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ulong uVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  longlong lVar14;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  _Var15;
  const_iterator cVar16;
  long lVar17;
  undefined1 uVar18;
  undefined7 in_register_00000009;
  ushort *puVar19;
  pointer ppSVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *attribute;
  ulong uVar21;
  pointer ppFVar22;
  _Alloc_hider _Var23;
  long lVar24;
  undefined8 uVar25;
  pointer ppNVar26;
  pointer ppEVar27;
  StructDef *pSVar28;
  int iVar29;
  __normal_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __i;
  short sVar30;
  Parser *pPVar31;
  bool bVar32;
  vector<unsigned_short,_std::allocator<unsigned_short>_> used_proto_ids;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  proto_ids;
  string basename;
  voffset_t proto_id;
  string schema;
  Namespace *last_namespace;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148;
  undefined1 local_128 [32];
  _Prime_rehash_policy local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  StructDef *local_e0;
  undefined4 local_d4;
  Parser *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a0;
  string local_80;
  ProtoIdGapAction local_5c;
  string *local_58;
  Namespace *local_50;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  pointer local_38;
  
  local_d4 = (undefined4)CONCAT71(in_register_00000009,no_log);
  ppNVar26 = (parser->namespaces_).
             super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_e0 = (StructDef *)file_name;
  local_d0 = parser;
  local_58 = __return_storage_ptr__;
  if (ppNVar26 !=
      (parser->namespaces_).
      super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      this = *ppNVar26;
      uVar12 = this->from_table;
      if (uVar12 != 0) {
        lVar24 = -0x20;
        uVar21 = 0;
        do {
          std::__cxx11::string::append
                    ((char *)((long)&(((this->components).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                     _M_p + lVar24));
          uVar21 = uVar21 + 1;
          uVar12 = this->from_table;
          lVar24 = lVar24 + -0x20;
        } while (uVar21 < uVar12);
      }
      pPVar31 = local_d0;
      if (((local_d0->opts).proto_mode == true) &&
         ((local_d0->opts).proto_namespace_suffix._M_string_length != 0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(&this->components,
                 (this->components).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -uVar12,
                 &(parser->opts).proto_namespace_suffix);
      }
      ppNVar26 = ppNVar26 + 1;
    } while (ppNVar26 !=
             (pPVar31->namespaces_).
             super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_168,"// Generated from ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
  pPVar31 = local_d0;
  puVar19 = (ushort *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar19) {
    local_128._16_8_ = *(undefined8 *)puVar19;
    local_128._24_8_ = puVar8[3];
    local_128._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_128 + 0x10);
  }
  else {
    local_128._16_8_ = *(undefined8 *)puVar19;
    local_128._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar8;
  }
  local_128._8_8_ = puVar8[1];
  *puVar8 = puVar19;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_a0,local_128._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_128 + 0x10)) {
    operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,(ulong)(local_168.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((pPVar31->opts).include_dependence_headers == true) {
    p_Var9 = (pPVar31->included_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(pPVar31->included_files_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var9 != p_Var1) {
      iVar29 = 0;
      do {
        if (p_Var9[1]._M_left != (_Base_ptr)0x0) {
          local_128._0_8_ = local_128 + 0x10;
          local_128._8_8_ = 0;
          local_128._16_8_ = local_128._16_8_ & 0xffffffffffffff00;
          if ((local_d0->opts).keep_prefix == true) {
            StripExtension(&local_168,(string *)&p_Var9[1]._M_parent);
            std::__cxx11::string::operator=((string *)local_128,(string *)&local_168);
            uVar25 = local_168.field_2._M_allocated_capacity;
            _Var23._M_p = local_168._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
LAB_0015512d:
              operator_delete(_Var23._M_p,(ulong)(uVar25 + 1));
            }
          }
          else {
            StripExtension(&local_148,(string *)&p_Var9[1]._M_parent);
            StripPath(&local_168,&local_148);
            std::__cxx11::string::operator=((string *)local_128,(string *)&local_168);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              operator_delete(local_168._M_dataplus._M_p,
                              (ulong)(local_168.field_2._M_allocated_capacity + 1));
            }
            uVar25 = local_148.field_2._M_allocated_capacity;
            _Var23._M_p = local_148._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) goto LAB_0015512d;
          }
          std::operator+(&local_148,"include \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128);
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          puVar19 = (ushort *)(puVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar19) {
            local_168.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
            local_168.field_2._8_8_ = puVar8[3];
          }
          else {
            local_168.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
            local_168._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_168._M_string_length = puVar8[1];
          *puVar8 = puVar19;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_168._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,
                            (ulong)(local_168.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,
                            (ulong)(local_148.field_2._M_allocated_capacity + 1));
          }
          if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
            operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
          }
          iVar29 = iVar29 + 1;
        }
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
        pPVar31 = local_d0;
      } while ((_Rb_tree_header *)p_Var9 != p_Var1);
      if (iVar29 != 0) {
        std::__cxx11::string::append((char *)&local_a0);
      }
    }
  }
  local_50 = (Namespace *)0x0;
  pSVar28 = (StructDef *)
            (pPVar31->enums_).vec.
            super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (pSVar28 !=
      (StructDef *)
      (pPVar31->enums_).vec.
      super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_128 + 0x10);
      this_00 = (EnumDef *)(pSVar28->super_Definition).name._M_dataplus._M_p;
      if (((pPVar31->opts).include_dependence_headers != true) ||
         ((this_00->super_Definition).generated == false)) {
        GenNameSpace((this_00->super_Definition).defined_namespace,&local_a0,&local_50);
        uVar18 = 0x69;
        GenComment(&(this_00->super_Definition).doc_comment,&local_a0,(CommentConfig *)0x0,"");
        if (this_00->is_union == true) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128,"union ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         this_00);
          std::__cxx11::string::_M_append((char *)&local_a0,local_128._0_8_);
          uVar25 = local_128._16_8_;
          _Var23._M_p = (pointer)local_128._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._0_8_ != paVar13) {
LAB_001553a3:
            operator_delete(_Var23._M_p,(ulong)(uVar25 + 1));
          }
        }
        else {
          std::operator+(&local_168,"enum ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         this_00);
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
          puVar19 = (ushort *)(puVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar19) {
            local_128._16_8_ = *(undefined8 *)puVar19;
            local_128._24_8_ = puVar8[3];
            local_128._0_8_ = paVar13;
          }
          else {
            local_128._16_8_ = *(undefined8 *)puVar19;
            local_128._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar8;
          }
          local_128._8_8_ = puVar8[1];
          *puVar8 = puVar19;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_a0,local_128._0_8_);
          uVar18 = SUB81(puVar19,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._0_8_ != paVar13) {
            operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
          }
          uVar25 = local_168.field_2._M_allocated_capacity;
          _Var23._M_p = local_168._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) goto LAB_001553a3;
        }
        (anonymous_namespace)::GenType_abi_cxx11_
                  (&local_168,(_anonymous_namespace_ *)&this_00->underlying_type,(Type *)0x1,
                   (bool)uVar18);
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
        puVar19 = (ushort *)(puVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar19) {
          local_128._16_8_ = *(undefined8 *)puVar19;
          local_128._24_8_ = puVar8[3];
          local_128._0_8_ = paVar13;
        }
        else {
          local_128._16_8_ = *(undefined8 *)puVar19;
          local_128._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar8;
        }
        local_128._8_8_ = puVar8[1];
        *puVar8 = puVar19;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_a0,local_128._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._0_8_ != paVar13) {
          operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
        }
        local_e0 = pSVar28;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,
                          (ulong)(local_168.field_2._M_allocated_capacity + 1));
        }
        for (ppEVar27 = (this_00->vals).vec.
                        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            ppEVar27 !=
            *(pointer *)
             ((long)&(this_00->vals).vec.
                     super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
             + 8); ppEVar27 = ppEVar27 + 1) {
          ev = *ppEVar27;
          uVar18 = 0xb7;
          GenComment(&ev->doc_comment,&local_a0,(CommentConfig *)0x0,"  ");
          if (this_00->is_union == true) {
            (anonymous_namespace)::GenType_abi_cxx11_
                      (&local_148,(_anonymous_namespace_ *)&ev->union_type,(Type *)0x0,(bool)uVar18)
            ;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_148,0,(char *)0x0,0x1d04b7);
            local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
            puVar19 = (ushort *)(puVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar19) {
              local_168.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
              local_168.field_2._8_8_ = puVar8[3];
            }
            else {
              local_168.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
              local_168._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_168._M_string_length = puVar8[1];
            *puVar8 = puVar19;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
            local_128._0_8_ = local_128 + 0x10;
            puVar19 = (ushort *)(puVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar19) {
              local_128._16_8_ = *(undefined8 *)puVar19;
              local_128._24_8_ = puVar8[3];
            }
            else {
              local_128._16_8_ = *(undefined8 *)puVar19;
              local_128._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar8;
            }
            local_128._8_8_ = puVar8[1];
            *puVar8 = puVar19;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_a0,local_128._0_8_);
            if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
              operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              operator_delete(local_168._M_dataplus._M_p,
                              (ulong)(local_168.field_2._M_allocated_capacity + 1));
            }
            uVar25 = local_148.field_2._M_allocated_capacity;
            _Var23._M_p = local_148._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
LAB_00155802:
              operator_delete(_Var23._M_p,(ulong)(uVar25 + 1));
            }
          }
          else {
            std::operator+(&local_c8,"  ",&ev->name);
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            puVar19 = (ushort *)(puVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar19) {
              local_148.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
              local_148.field_2._8_8_ = puVar8[3];
            }
            else {
              local_148.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
              local_148._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_148._M_string_length = puVar8[1];
            *puVar8 = puVar19;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            EnumDef::ToString_abi_cxx11_(&local_80,this_00,ev);
            uVar25 = (byte *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              uVar25 = local_148.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar25 < (byte *)(local_148._M_string_length + local_80._M_string_length)) {
              uVar25 = (byte *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                uVar25 = local_80.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar25 < (byte *)(local_148._M_string_length + local_80._M_string_length))
              goto LAB_00155614;
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_80,0,(char *)0x0,(ulong)local_148._M_dataplus._M_p);
            }
            else {
LAB_00155614:
              puVar8 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_148,(ulong)local_80._M_dataplus._M_p);
            }
            local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
            puVar19 = (ushort *)(puVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar19) {
              local_168.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
              local_168.field_2._8_8_ = puVar8[3];
            }
            else {
              local_168.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
              local_168._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_168._M_string_length = puVar8[1];
            *puVar8 = puVar19;
            puVar8[1] = 0;
            *(byte *)puVar19 = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
            local_128._0_8_ = local_128 + 0x10;
            puVar19 = (ushort *)(puVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar19) {
              local_128._16_8_ = *(undefined8 *)puVar19;
              local_128._24_8_ = puVar8[3];
            }
            else {
              local_128._16_8_ = *(undefined8 *)puVar19;
              local_128._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar8;
            }
            local_128._8_8_ = puVar8[1];
            *puVar8 = puVar19;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_a0,local_128._0_8_);
            if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
              operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              operator_delete(local_168._M_dataplus._M_p,
                              (ulong)(local_168.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,
                              (ulong)(local_80.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,
                              (ulong)(local_148.field_2._M_allocated_capacity + 1));
            }
            uVar25 = local_c8.field_2._M_allocated_capacity;
            _Var23._M_p = local_c8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) goto LAB_00155802;
          }
        }
        std::__cxx11::string::append((char *)&local_a0);
        pSVar28 = local_e0;
      }
      pSVar28 = (StructDef *)&(pSVar28->super_Definition).name._M_string_length;
      pPVar31 = local_d0;
    } while (pSVar28 !=
             (StructDef *)
             (local_d0->enums_).vec.
             super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  ppSVar20 = (pPVar31->structs_).vec.
             super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppSVar20 !=
      (pPVar31->structs_).vec.
      super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_40 = &local_58->field_2;
    do {
      pSVar28 = *ppSVar20;
      PVar4 = (pPVar31->opts).proto_id_gap_action;
      local_38 = ppSVar20;
      if ((anonymous_namespace)::
          HasFieldWithId(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
          ::ID_abi_cxx11_ == '\0') {
        _GLOBAL__N_1::GenerateFBS();
      }
      ppFVar5 = (pSVar28->fields).vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      local_e0 = pSVar28;
      for (ppFVar22 = (pSVar28->fields).vec.
                      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; bVar32 = ppFVar22 == ppFVar5,
          !bVar32; ppFVar22 = ppFVar22 + 1) {
        pFVar6 = *ppFVar22;
        cVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                         *)&(pFVar6->super_Definition).attributes,
                        (key_type *)
                        (anonymous_namespace)::
                        HasFieldWithId(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                        ::ID_abi_cxx11_);
        if ((_Rb_tree_header *)cVar10._M_node ==
            &(pFVar6->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
          lVar24 = 0;
        }
        else {
          lVar24 = *(long *)(cVar10._M_node + 2);
        }
        if ((lVar24 != 0) && (*(long *)(lVar24 + 0x28) != 0)) break;
      }
      pSVar28 = local_e0;
      if (bVar32) {
        local_128._0_8_ = &local_f8;
        local_128._8_8_ = 1;
        local_128._16_8_ = (byte *)0x0;
        local_128._24_8_ = 0;
        local_108._M_max_load_factor = 1.0;
        local_108._M_next_resize = 0;
        local_f8._M_allocated_capacity = 0;
        local_f8._M_local_buf[8] = '\x01';
      }
      else {
        if ((anonymous_namespace)::
            HasNonPositiveFieldId(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
            ::ID_abi_cxx11_ == '\0') {
          _GLOBAL__N_1::GenerateFBS();
        }
        ppFVar5 = (pSVar28->fields).vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppFVar22 = (pSVar28->fields).vec.
                        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; bVar32 = ppFVar22 == ppFVar5,
            !bVar32; ppFVar22 = ppFVar22 + 1) {
          pFVar6 = *ppFVar22;
          cVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                           *)&(pFVar6->super_Definition).attributes,
                          (key_type *)
                          (anonymous_namespace)::
                          HasNonPositiveFieldId(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                          ::ID_abi_cxx11_);
          if ((_Rb_tree_header *)cVar10._M_node ==
              &(pFVar6->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
            lVar24 = 0;
          }
          else {
            lVar24 = *(long *)(cVar10._M_node + 2);
          }
          if ((lVar24 != 0) && (*(long *)(lVar24 + 0x28) != 0)) {
            paVar13 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        **)(lVar24 + 0x20);
            paVar11 = paVar13;
            if (paVar13 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) goto LAB_00156877;
            do {
              bVar2 = paVar11->_M_local_buf[0];
              paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar11->_M_local_buf + 1);
              if (bVar2 == 0) break;
            } while (9 < (int)(char)bVar2 - 0x30U);
            if ((bVar2 == 0x30) && ((paVar11->_M_local_buf[0] & 0xdfU) == 0x58)) {
              iVar29 = 0x10;
            }
            else {
              iVar29 = 10;
            }
            local_168._M_dataplus._M_p = (pointer)paVar13;
            uVar12 = strtoll_l(paVar13->_M_local_buf,(char **)&local_168,iVar29,
                               ClassicLocale::instance_);
            if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_168._M_dataplus._M_p == paVar13 || *local_168._M_dataplus._M_p != 0) ||
               (0xffff < uVar12)) break;
          }
        }
        pSVar28 = local_e0;
        if (bVar32) {
          local_48 = &(local_e0->fields).vec;
          local_5c = PVar4;
          ExtractProtobufIds((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_168,
                             local_48);
          sVar7 = local_168._M_string_length;
          _Var23._M_p = local_168._M_dataplus._M_p;
          if (local_168._M_dataplus._M_p != (pointer)local_168._M_string_length) {
            uVar12 = (long)(local_168._M_string_length - (long)local_168._M_dataplus._M_p) >> 1;
            lVar24 = 0x3f;
            if (uVar12 != 0) {
              for (; uVar12 >> lVar24 == 0; lVar24 = lVar24 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_168._M_dataplus._M_p,local_168._M_string_length,
                       ((uint)lVar24 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (_Var23._M_p,sVar7);
            _Var23._M_p = local_168._M_dataplus._M_p;
          }
          do {
            sVar7 = local_168._M_string_length;
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)_Var23._M_p + 2);
            if (paVar13 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_string_length) break;
            uVar3 = *(ushort *)_Var23._M_p;
            _Var23._M_p = (pointer)paVar13;
          } while (*(ushort *)paVar13 != uVar3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_168._M_dataplus._M_p,
                            local_168.field_2._M_allocated_capacity -
                            (long)local_168._M_dataplus._M_p);
          }
          if (paVar13 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sVar7) {
            goto joined_r0x00155c8a;
          }
          if ((anonymous_namespace)::
              HasFieldIdFromReservedIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&,std::vector<unsigned_short,std::allocator<unsigned_short>>const&)
              ::ID_abi_cxx11_ == '\0') {
            _GLOBAL__N_1::GenerateFBS();
          }
          ppFVar22 = (pSVar28->fields).vec.
                     super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppFVar5 = (pSVar28->fields).vec.
                    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          bVar32 = ppFVar22 != ppFVar5;
          if (bVar32) {
            bVar32 = true;
            do {
              pFVar6 = *ppFVar22;
              cVar10 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                               *)&(pFVar6->super_Definition).attributes,
                              (key_type *)
                              (anonymous_namespace)::
                              HasFieldIdFromReservedIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&,std::vector<unsigned_short,std::allocator<unsigned_short>>const&)
                              ::ID_abi_cxx11_);
              if ((_Rb_tree_header *)cVar10._M_node ==
                  &(pFVar6->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
                lVar24 = 0;
              }
              else {
                lVar24 = *(long *)(cVar10._M_node + 2);
              }
              if ((lVar24 != 0) && (*(long *)(lVar24 + 0x28) != 0)) {
                local_148._M_dataplus._M_p = local_148._M_dataplus._M_p & 0xffffffffffff0000;
                paVar13 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            **)(lVar24 + 0x20);
                paVar11 = paVar13;
                if (paVar13 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) goto LAB_00156877;
                do {
                  bVar2 = paVar11->_M_local_buf[0];
                  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(paVar11->_M_local_buf + 1);
                  if (bVar2 == 0) break;
                } while (9 < (int)(char)bVar2 - 0x30U);
                if ((bVar2 == 0x30) && ((paVar11->_M_local_buf[0] & 0xdfU) == 0x58)) {
                  iVar29 = 0x10;
                }
                else {
                  iVar29 = 10;
                }
                local_168._M_dataplus._M_p = (pointer)paVar13;
                lVar14 = strtoll_l(paVar13->_M_local_buf,(char **)&local_168,iVar29,
                                   ClassicLocale::instance_);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168._M_dataplus._M_p == paVar13 || *local_168._M_dataplus._M_p != 0) {
                  local_148._M_dataplus._M_p =
                       (pointer)((ulong)local_148._M_dataplus._M_p._2_6_ << 0x10);
                  break;
                }
                if ((0xffff < lVar14) || (lVar14 < 0)) {
                  local_148._M_dataplus._M_p._0_2_ = 0xffff;
                  break;
                }
                local_148._M_dataplus._M_p._0_2_ = (short)lVar14;
                _Var15 = std::
                         __find_if<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_short_const>>
                                   ((pSVar28->reserved_ids).
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (pSVar28->reserved_ids).
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,&local_148);
                if (_Var15._M_current !=
                    (pSVar28->reserved_ids).
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_finish) break;
              }
              ppFVar22 = ppFVar22 + 1;
              bVar32 = ppFVar22 != ppFVar5;
            } while (bVar32);
          }
          if (bVar32) {
            goto joined_r0x00155c8a;
          }
          if (local_5c == NO_OP) {
LAB_00156450:
            local_148._M_dataplus._M_p = (pointer)0x0;
            local_148._M_string_length = 0;
            local_148.field_2._M_allocated_capacity = 0;
            ppFVar5 = (pSVar28->fields).vec.
                      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppFVar22 = (pSVar28->fields).vec.
                            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                sVar7 = local_148._M_string_length, _Var23._M_p = local_148._M_dataplus._M_p,
                ppFVar22 != ppFVar5; ppFVar22 = ppFVar22 + 1) {
              pFVar6 = *ppFVar22;
              local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
              local_168._M_string_length = 2;
              local_168.field_2._M_allocated_capacity._0_3_ = 0x6469;
              cVar10 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                               *)&(pFVar6->super_Definition).attributes,&local_168);
              if ((_Rb_tree_header *)cVar10._M_node ==
                  &(pFVar6->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
                lVar24 = 0;
              }
              else {
                lVar24 = *(long *)(cVar10._M_node + 2);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p != &local_168.field_2) {
                operator_delete(local_168._M_dataplus._M_p,
                                (ulong)(local_168.field_2._M_allocated_capacity + 1));
              }
              if (lVar24 == 0) {
                if ((char)local_d4 == '\0') {
                  _GLOBAL__N_1::GenerateFBS((_GLOBAL__N_1 *)pSVar28);
                }
                local_128._0_8_ = &local_f8;
                local_128._8_8_ = 1;
                local_128._16_8_ = (byte *)0x0;
                local_128._24_8_ = 0;
                local_108._M_max_load_factor = 1.0;
                local_108._4_4_ = 0;
                local_108._M_next_resize = 0;
                local_f8._M_allocated_capacity = 0;
                local_f8._M_local_buf[8] = '\0';
              }
              else if ((*(long *)(lVar24 + 0x28) == 0) &&
                      ((pFVar6->value).type.base_type == BASE_TYPE_UNION)) {
                std::
                vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                ::emplace_back<int_const&,std::__cxx11::string_const&>
                          ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                            *)&local_148,
                           &(anonymous_namespace)::
                            MapProtoIdsToFieldsId(flatbuffers::StructDef_const&,flatbuffers::IDLOptions::ProtoIdGapAction,bool)
                            ::UNION_ID,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pFVar6);
              }
              else {
                local_c8._M_dataplus._M_p = local_c8._M_dataplus._M_p & 0xffffffffffff0000;
                paVar13 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            **)(lVar24 + 0x20);
                paVar11 = paVar13;
                if (paVar13 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
LAB_00156877:
                  __assert_fail("s && val",
                                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/util.h"
                                ,0x14b,
                                "bool flatbuffers::StringToNumber(const char *, T *) [T = unsigned short]"
                               );
                }
                do {
                  bVar2 = paVar11->_M_local_buf[0];
                  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(paVar11->_M_local_buf + 1);
                  if (bVar2 == 0) break;
                } while (9 < (int)(char)bVar2 - 0x30U);
                if ((bVar2 == 0x30) && ((paVar11->_M_local_buf[0] & 0xdfU) == 0x58)) {
                  iVar29 = 0x10;
                }
                else {
                  iVar29 = 10;
                }
                local_168._M_dataplus._M_p = (pointer)paVar13;
                lVar17 = strtoll_l(paVar13->_M_local_buf,(char **)&local_168,iVar29,
                                   ClassicLocale::instance_);
                pSVar28 = local_e0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168._M_dataplus._M_p == paVar13 || *local_168._M_dataplus._M_p != 0U) {
                  lVar17 = 0;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168._M_dataplus._M_p == paVar13 || *local_168._M_dataplus._M_p != 0U) {
                  local_c8._M_dataplus._M_p =
                       (pointer)((ulong)local_c8._M_dataplus._M_p._2_6_ << 0x10);
                }
                else if (lVar17 < 0x10000) {
                  if (lVar17 < 0) {
                    local_c8._M_dataplus._M_p._0_2_ = 0xffff;
                  }
                  else {
                    local_c8._M_dataplus._M_p._0_2_ = (short)lVar17;
                  }
                }
                else {
                  local_c8._M_dataplus._M_p._0_2_ = 0xffff;
                }
                std::
                vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                ::emplace_back<unsigned_short&,std::__cxx11::string_const&>
                          ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                            *)&local_148,(unsigned_short *)&local_c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pFVar6);
              }
              if (lVar24 == 0) goto LAB_00156798;
            }
            if (local_148._M_dataplus._M_p != (pointer)local_148._M_string_length) {
              lVar17 = local_148._M_string_length - (long)local_148._M_dataplus._M_p;
              uVar12 = (lVar17 >> 3) * -0x3333333333333333;
              lVar24 = 0x3f;
              if (uVar12 != 0) {
                for (; uVar12 >> lVar24 == 0; lVar24 = lVar24 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,std::__cxx11::string>*,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<flatbuffers::(anonymous_namespace)::MapProtoIdsToFieldsId(flatbuffers::StructDef_const&,flatbuffers::IDLOptions::ProtoIdGapAction,bool)::__0>>
                        (local_148._M_dataplus._M_p,local_148._M_string_length,
                         ((uint)lVar24 ^ 0x3f) * 2 ^ 0x7e);
              if (lVar17 < 0x281) {
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,std::__cxx11::string>*,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<flatbuffers::(anonymous_namespace)::MapProtoIdsToFieldsId(flatbuffers::StructDef_const&,flatbuffers::IDLOptions::ProtoIdGapAction,bool)::__0>>
                          (_Var23._M_p,sVar7);
              }
              else {
                puVar19 = (ushort *)(_Var23._M_p + 0x280);
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,std::__cxx11::string>*,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<flatbuffers::(anonymous_namespace)::MapProtoIdsToFieldsId(flatbuffers::StructDef_const&,flatbuffers::IDLOptions::ProtoIdGapAction,bool)::__0>>
                          (_Var23._M_p,puVar19);
                for (; puVar19 != (ushort *)sVar7; puVar19 = puVar19 + 0x14) {
                  std::
                  __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<int,std::__cxx11::string>*,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Val_comp_iter<flatbuffers::(anonymous_namespace)::MapProtoIdsToFieldsId(flatbuffers::StructDef_const&,flatbuffers::IDLOptions::ProtoIdGapAction,bool)::__0>>
                            (puVar19);
                }
              }
            }
            sVar7 = local_148._M_string_length;
            local_128._0_8_ = &local_f8;
            local_128._8_8_ = 1;
            local_128._16_8_ = (byte *)0x0;
            local_128._24_8_ = 0;
            local_108._M_max_load_factor = 1.0;
            local_108._M_next_resize = 0;
            local_f8._M_allocated_capacity = 0;
            local_f8._M_local_buf[8] = '\0';
            if (local_148._M_dataplus._M_p != (pointer)local_148._M_string_length) {
              sVar30 = 0;
              _Var23._M_p = local_148._M_dataplus._M_p;
              do {
                sVar30 = sVar30 + (ushort)(*(int *)_Var23._M_p == -1);
                local_168._M_dataplus._M_p._0_2_ = sVar30;
                std::
                _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_short>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_short>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                ::_M_emplace<std::__cxx11::string_const&,unsigned_short>
                          ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_short>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_short>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                            *)local_128,(ushort *)((long)_Var23._M_p + 8),&local_168);
                sVar30 = sVar30 + 1;
                _Var23._M_p = _Var23._M_p + 0x28;
              } while (_Var23._M_p != (pointer)sVar7);
            }
            local_f8._M_local_buf[8] = '\x01';
            pSVar28 = local_e0;
LAB_00156798:
            std::
            vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_148);
            goto LAB_00155da3;
          }
          ExtractProtobufIds((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_168,
                             local_48);
          sVar7 = local_168._M_string_length;
          _Var23._M_p = local_168._M_dataplus._M_p;
          if (local_168._M_dataplus._M_p != (pointer)local_168._M_string_length) {
            uVar12 = (long)(local_168._M_string_length - (long)local_168._M_dataplus._M_p) >> 1;
            lVar24 = 0x3f;
            if (uVar12 != 0) {
              for (; uVar12 >> lVar24 == 0; lVar24 = lVar24 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_168._M_dataplus._M_p,local_168._M_string_length,
                       ((uint)lVar24 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (_Var23._M_p,sVar7);
            _Var23._M_p = local_168._M_dataplus._M_p;
          }
          do {
            sVar7 = local_168._M_string_length;
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)_Var23._M_p + 2);
            if (paVar13 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_string_length) break;
            uVar3 = *(ushort *)_Var23._M_p;
            _Var23._M_p = (pointer)paVar13;
          } while (uVar3 + 1 == (uint)*(ushort *)paVar13);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_168._M_dataplus._M_p,
                            local_168.field_2._M_allocated_capacity -
                            (long)local_168._M_dataplus._M_p);
          }
          if (paVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sVar7) goto LAB_00156450;
          if ((char)local_d4 == '\0') {
            _GLOBAL__N_1::GenerateFBS((_GLOBAL__N_1 *)pSVar28);
          }
          if (local_5c != ERROR) goto LAB_00156450;
        }
        else {
joined_r0x00155c8a:
          if ((char)local_d4 == '\0') {
            _GLOBAL__N_1::GenerateFBS();
          }
        }
        local_128._0_8_ = &local_f8;
        local_128._8_8_ = 1;
        local_128._16_8_ = (byte *)0x0;
        local_128._24_8_ = 0;
        local_108._M_max_load_factor = 1.0;
        local_108._4_4_ = 0;
        local_108._M_next_resize = 0;
        local_f8._M_allocated_capacity = 0;
        local_f8._M_local_buf[8] = '\0';
      }
LAB_00155da3:
      if (local_f8._M_local_buf[8] == '\0') {
        (local_58->_M_dataplus)._M_p = (pointer)local_40;
        local_58->_M_string_length = 0;
        (local_58->field_2)._M_local_buf[0] = '\0';
        iVar29 = 1;
      }
      else if (((local_d0->opts).include_dependence_headers != true) ||
              (iVar29 = 0x13, (pSVar28->super_Definition).generated == false)) {
        GenNameSpace((pSVar28->super_Definition).defined_namespace,&local_a0,&local_50);
        GenComment(&(pSVar28->super_Definition).doc_comment,&local_a0,(CommentConfig *)0x0,"");
        std::operator+(&local_148,"table ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar28)
        ;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        puVar19 = (ushort *)(puVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar19) {
          local_168.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
          local_168.field_2._8_8_ = puVar8[3];
        }
        else {
          local_168.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
          local_168._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_168._M_string_length = puVar8[1];
        *puVar8 = puVar19;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_168._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,
                          (ulong)(local_168.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,
                          (ulong)(local_148.field_2._M_allocated_capacity + 1));
        }
        ppFVar22 = (pSVar28->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if (ppFVar22 !=
            (pSVar28->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          do {
            pFVar6 = *ppFVar22;
            if ((pFVar6->value).type.base_type != BASE_TYPE_UTYPE) {
              GenComment(&(pFVar6->super_Definition).doc_comment,&local_a0,(CommentConfig *)0x0,"  "
                        );
              std::operator+(&local_c8,"  ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pFVar6);
              puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
              local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
              puVar19 = (ushort *)(puVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar19) {
                local_148.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
                local_148.field_2._8_8_ = puVar8[3];
              }
              else {
                local_148.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
                local_148._M_dataplus._M_p = (pointer)*puVar8;
              }
              local_148._M_string_length = puVar8[1];
              *puVar8 = puVar19;
              puVar8[1] = 0;
              *(undefined1 *)(puVar8 + 2) = 0;
              (anonymous_namespace)::GenType_abi_cxx11_
                        (&local_80,(_anonymous_namespace_ *)&pFVar6->value,(Type *)0x0,
                         SUB81(puVar19,0));
              uVar25 = (byte *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                uVar25 = local_148.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar25 < (byte *)(local_148._M_string_length + local_80._M_string_length))
              {
                uVar25 = (byte *)0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_80._M_dataplus._M_p != &local_80.field_2) {
                  uVar25 = local_80.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar25 < (byte *)(local_148._M_string_length + local_80._M_string_length)
                   ) goto LAB_00155ffa;
                puVar8 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_80,0,(char *)0x0,(ulong)local_148._M_dataplus._M_p
                                   );
              }
              else {
LAB_00155ffa:
                puVar8 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_148,(ulong)local_80._M_dataplus._M_p);
              }
              local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
              puVar19 = (ushort *)(puVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar19) {
                local_168.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
                local_168.field_2._8_8_ = puVar8[3];
              }
              else {
                local_168.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
                local_168._M_dataplus._M_p = (pointer)*puVar8;
              }
              local_168._M_string_length = puVar8[1];
              *puVar8 = puVar19;
              puVar8[1] = 0;
              *(byte *)puVar19 = 0;
              std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_168._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p != &local_168.field_2) {
                operator_delete(local_168._M_dataplus._M_p,
                                (ulong)(local_168.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                operator_delete(local_80._M_dataplus._M_p,
                                (ulong)(local_80.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                operator_delete(local_148._M_dataplus._M_p,
                                (ulong)(local_148.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p,
                                (ulong)(local_c8.field_2._M_allocated_capacity + 1));
              }
              __rhs = &(pFVar6->value).constant;
              iVar29 = std::__cxx11::string::compare((char *)__rhs);
              if (iVar29 != 0) {
                std::operator+(&local_168," = ",__rhs);
                std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_168._M_dataplus._M_p)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168._M_dataplus._M_p != &local_168.field_2) {
                  operator_delete(local_168._M_dataplus._M_p,
                                  (ulong)(local_168.field_2._M_allocated_capacity + 1));
                }
              }
              local_c8._M_dataplus._M_p = (pointer)0x0;
              local_c8._M_string_length = 0;
              local_c8.field_2._M_allocated_capacity = 0;
              if (pFVar6->presence == kRequired) {
                local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"required","");
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_c8,&local_168);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168._M_dataplus._M_p != &local_168.field_2) {
                  operator_delete(local_168._M_dataplus._M_p,
                                  (ulong)(local_168.field_2._M_allocated_capacity + 1));
                }
              }
              if (pFVar6->key == true) {
                local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"key","");
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_c8,&local_168);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168._M_dataplus._M_p != &local_168.field_2) {
                  operator_delete(local_168._M_dataplus._M_p,
                                  (ulong)(local_168.field_2._M_allocated_capacity + 1));
                }
              }
              if (((local_d0->opts).keep_proto_id == true) &&
                 (cVar16 = std::
                           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                   *)local_128,(key_type *)pFVar6),
                 cVar16.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_true>
                 ._M_cur != (__node_type *)0x0)) {
                NumToString<unsigned_short>
                          (&local_148,
                           *(unsigned_short *)
                            ((long)cVar16.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_true>
                                   ._M_cur + 0x28));
                puVar8 = (undefined8 *)
                         std::__cxx11::string::replace((ulong)&local_148,0,(char *)0x0,0x1b63f1);
                local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                puVar19 = (ushort *)(puVar8 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar8 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar19) {
                  local_168.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
                  local_168.field_2._8_8_ = puVar8[3];
                }
                else {
                  local_168.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
                  local_168._M_dataplus._M_p = (pointer)*puVar8;
                }
                local_168._M_string_length = puVar8[1];
                *puVar8 = puVar19;
                puVar8[1] = 0;
                *(undefined1 *)(puVar8 + 2) = 0;
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_c8,&local_168);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168._M_dataplus._M_p != &local_168.field_2) {
                  operator_delete(local_168._M_dataplus._M_p,
                                  (ulong)(local_168.field_2._M_allocated_capacity + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_148._M_dataplus._M_p != &local_148.field_2) {
                  operator_delete(local_148._M_dataplus._M_p,
                                  (ulong)(local_148.field_2._M_allocated_capacity + 1));
                }
              }
              if (local_c8._M_dataplus._M_p != (pointer)local_c8._M_string_length) {
                std::__cxx11::string::append((char *)&local_a0);
                sVar7 = local_c8._M_string_length;
                for (_Var23._M_p = local_c8._M_dataplus._M_p; _Var23._M_p != (pointer)sVar7;
                    _Var23._M_p = _Var23._M_p + 0x20) {
                  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_168,*(size_type *)_Var23._M_p,
                             *(long *)((long)_Var23._M_p + 8) + *(size_type *)_Var23._M_p);
                  std::__cxx11::string::append((char *)&local_168);
                  std::__cxx11::string::_M_append
                            ((char *)&local_a0,(ulong)local_168._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_168._M_dataplus._M_p != &local_168.field_2) {
                    operator_delete(local_168._M_dataplus._M_p,
                                    (ulong)(local_168.field_2._M_allocated_capacity + 1));
                  }
                }
                std::__cxx11::string::pop_back();
                std::__cxx11::string::append((char *)&local_a0);
              }
              std::__cxx11::string::append((char *)&local_a0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_c8);
            }
            ppFVar22 = ppFVar22 + 1;
          } while (ppFVar22 !=
                   (local_e0->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        iVar29 = 0;
        std::__cxx11::string::append((char *)&local_a0);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_128);
      if ((iVar29 != 0x13) && (iVar29 != 0)) goto LAB_00156838;
      ppSVar20 = local_38 + 1;
      pPVar31 = local_d0;
    } while (ppSVar20 !=
             (local_d0->structs_).vec.
             super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p == &local_a0.field_2) {
    (local_58->field_2)._M_allocated_capacity =
         CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,local_a0.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&local_58->field_2 + 8) = local_a0.field_2._8_8_;
  }
  else {
    (local_58->_M_dataplus)._M_p = local_a0._M_dataplus._M_p;
    (local_58->field_2)._M_allocated_capacity =
         CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,local_a0.field_2._M_local_buf[0]);
  }
  local_58->_M_string_length = local_a0._M_string_length;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
LAB_00156838:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  return local_58;
}

Assistant:

static std::string GenerateFBS(const Parser &parser,
                               const std::string &file_name,
                               bool no_log = false) {
  // Proto namespaces may clash with table names, escape the ones that were
  // generated from a table:
  for (auto it = parser.namespaces_.begin(); it != parser.namespaces_.end();
       ++it) {
    auto &ns = **it;
    for (size_t i = 0; i < ns.from_table; i++) {
      ns.components[ns.components.size() - 1 - i] += "_";
    }

    if (parser.opts.proto_mode && !parser.opts.proto_namespace_suffix.empty()) {
      // Since we know that all these namespaces come from a .proto, and all are
      // being converted, we can simply apply this suffix to all of them.
      ns.components.insert(ns.components.end() - ns.from_table,
                           parser.opts.proto_namespace_suffix);
    }
  }

  std::string schema;
  schema += "// Generated from " + file_name + ".proto\n\n";
  if (parser.opts.include_dependence_headers) {
    // clang-format off
    int num_includes = 0;
    for (auto it = parser.included_files_.begin();
         it != parser.included_files_.end(); ++it) {
      if (it->second.empty()) {
        continue;
}
      std::string basename;
      if(parser.opts.keep_prefix) {
        basename = flatbuffers::StripExtension(it->second);
      } else {
        basename = flatbuffers::StripPath(
                flatbuffers::StripExtension(it->second));
      }
      schema += "include \"" + basename + ".fbs\";\n";
      num_includes++;
    }
    if (num_includes) schema += "\n";
    // clang-format on
  }

  // Generate code for all the enum declarations.
  const Namespace *last_namespace = nullptr;
  for (auto enum_def_it = parser.enums_.vec.begin();
       enum_def_it != parser.enums_.vec.end(); ++enum_def_it) {
    EnumDef &enum_def = **enum_def_it;
    if (parser.opts.include_dependence_headers && enum_def.generated) {
      continue;
    }
    GenNameSpace(*enum_def.defined_namespace, &schema, &last_namespace);
    GenComment(enum_def.doc_comment, &schema, nullptr);
    if (enum_def.is_union) {
      schema += "union " + enum_def.name;
    } else {
      schema += "enum " + enum_def.name + " : ";
    }

    schema += GenType(enum_def.underlying_type, true) + " {\n";

    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      GenComment(ev.doc_comment, &schema, nullptr, "  ");
      if (enum_def.is_union) {
        schema += "  " + GenType(ev.union_type) + ",\n";
      } else {
        schema += "  " + ev.name + " = " + enum_def.ToString(ev) + ",\n";
      }
    }
    schema += "}\n\n";
  }
  // Generate code for all structs/tables.
  for (auto it = parser.structs_.vec.begin(); it != parser.structs_.vec.end();
       ++it) {
    StructDef &struct_def = **it;
    const auto proto_fbs_ids = MapProtoIdsToFieldsId(
        struct_def, parser.opts.proto_id_gap_action, no_log);
    if (!proto_fbs_ids.successful) { return {}; }

    if (parser.opts.include_dependence_headers && struct_def.generated) {
      continue;
    }

    GenNameSpace(*struct_def.defined_namespace, &schema, &last_namespace);
    GenComment(struct_def.doc_comment, &schema, nullptr);
    schema += "table " + struct_def.name + " {\n";
    for (auto field_it = struct_def.fields.vec.begin();
         field_it != struct_def.fields.vec.end(); ++field_it) {
      auto &field = **field_it;
      if (field.value.type.base_type != BASE_TYPE_UTYPE) {
        GenComment(field.doc_comment, &schema, nullptr, "  ");
        schema += "  " + field.name + ":" + GenType(field.value.type);
        if (field.value.constant != "0") schema += " = " + field.value.constant;
        std::vector<std::string> attributes;
        if (field.IsRequired()) attributes.push_back("required");
        if (field.key) attributes.push_back("key");

        if (parser.opts.keep_proto_id) {
          auto it = proto_fbs_ids.field_to_id.find(field.name);
          if (it != proto_fbs_ids.field_to_id.end()) {
            attributes.push_back("id: " + NumToString(it->second));
          }  // If not found it means we do not have any ids
        }

        if (!attributes.empty()) {
          schema += " (";
          for (const auto &attribute : attributes) {
            schema += attribute + ",";
          }
          schema.pop_back();
          schema += ")";
        }

        schema += ";\n";
      }
    }
    schema += "}\n\n";
  }
  return schema;
}